

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop)

{
  bool chain;
  char *pcVar1;
  
  chain = cmState::IsPropertyChained
                    (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,prop,DIRECTORY);
  pcVar1 = GetProperty(this,prop,chain);
  return pcVar1;
}

Assistant:

const char *cmMakefile::GetProperty(const std::string& prop) const
{
  const bool chain = this->GetState()->
                  IsPropertyChained(prop, cmProperty::DIRECTORY);
  return this->GetProperty(prop, chain);
}